

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetEnumValue
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int value)

{
  CppType CVar1;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar2;
  LogMessage *pLVar3;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetEnumValue","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetEnumValue",
               "Field is repeated; the method requires a singular field.");
  }
  CVar1 = FieldDescriptor::cpp_type(field);
  if (CVar1 != CPPTYPE_ENUM) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetEnumValue",CPPTYPE_ENUM);
  }
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
    this_00 = FieldDescriptor::enum_type(field);
    pEVar2 = EnumDescriptor::FindValueByNumber(this_00,value);
    if (pEVar2 == (EnumValueDescriptor *)0x0) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x523);
      pLVar3 = LogMessage::operator<<
                         (&local_60,"SetEnumValue accepts only valid integer values: value ");
      pLVar3 = LogMessage::operator<<(pLVar3,value);
      pLVar3 = LogMessage::operator<<(pLVar3," unexpected for field ");
      pLVar3 = LogMessage::operator<<(pLVar3,*(string **)(field + 8));
      LogFinisher::operator=(&local_61,pLVar3);
      LogMessage::~LogMessage(&local_60);
      pEVar2 = FieldDescriptor::default_value_enum(field);
      value = *(int *)(pEVar2 + 0x10);
    }
  }
  SetEnumValueInternal(this,message,field,value);
  return;
}

Assistant:

void GeneratedMessageReflection::SetEnumValue(
    Message* message, const FieldDescriptor* field,
    int value) const {
  USAGE_CHECK_ALL(SetEnumValue, SINGULAR, ENUM);
  if (!CreateUnknownEnumValues(descriptor_->file())) {
    // Check that the value is valid if we don't support direct storage of
    // unknown enum values.
    const EnumValueDescriptor* value_desc =
        field->enum_type()->FindValueByNumber(value);
    if (value_desc == NULL) {
      GOOGLE_LOG(DFATAL) << "SetEnumValue accepts only valid integer values: value "
                  << value << " unexpected for field " << field->full_name();
      // In production builds, DFATAL will not terminate the program, so we have
      // to do something reasonable: just set the default value.
      value = field->default_value_enum()->number();
    }
  }
  SetEnumValueInternal(message, field, value);
}